

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O0

void __thiscall CTB<UFPC>::PerformLabelingWithSteps(CTB<UFPC> *this)

{
  PerformanceEvaluator *pPVar1;
  double dVar2;
  string local_88 [32];
  string local_68 [48];
  string local_38 [32];
  double local_18;
  double alloc_timing;
  CTB<UFPC> *this_local;
  
  alloc_timing = (double)this;
  local_18 = Alloc(this);
  pPVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(pPVar1);
  FirstScan(this);
  PerformanceEvaluator::stop(pPVar1);
  Step_abi_cxx11_((StepType)local_38);
  dVar2 = PerformanceEvaluator::last(pPVar1);
  PerformanceEvaluator::store(pPVar1,local_38,dVar2);
  std::__cxx11::string::~string((string *)local_38);
  pPVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(pPVar1);
  SecondScan(this);
  PerformanceEvaluator::stop(pPVar1);
  Step_abi_cxx11_((StepType)local_68);
  dVar2 = PerformanceEvaluator::last(pPVar1);
  PerformanceEvaluator::store(pPVar1,local_68,dVar2);
  std::__cxx11::string::~string((string *)local_68);
  pPVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(pPVar1);
  Dealloc(this);
  PerformanceEvaluator::stop(pPVar1);
  Step_abi_cxx11_((StepType)local_88);
  dVar2 = PerformanceEvaluator::last(pPVar1);
  PerformanceEvaluator::store(pPVar1,local_88,dVar2 + local_18);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void PerformLabelingWithSteps()
    {
        double alloc_timing = Alloc();

        perf_.start();
        FirstScan();
        perf_.stop();
        perf_.store(Step(StepType::FIRST_SCAN), perf_.last());

        perf_.start();
        SecondScan();
        perf_.stop();
        perf_.store(Step(StepType::SECOND_SCAN), perf_.last());

        perf_.start();
        Dealloc();
        perf_.stop();
        perf_.store(Step(StepType::ALLOC_DEALLOC), perf_.last() + alloc_timing);

    }